

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O3

void __thiscall xe::TestResultParser::pushItem(TestResultParser *this,Item *item)

{
  pointer *pppIVar1;
  iterator __position;
  Item *local_10;
  
  __position._M_current =
       (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_10 = item;
  if (__position._M_current ==
      (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<xe::ri::Item*,std::allocator<xe::ri::Item*>>::_M_realloc_insert<xe::ri::Item*const&>
              ((vector<xe::ri::Item*,std::allocator<xe::ri::Item*>> *)&this->m_itemStack,__position,
               &local_10);
  }
  else {
    *__position._M_current = item;
    pppIVar1 = &(this->m_itemStack).
                super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  updateCurrentItemList(this);
  return;
}

Assistant:

void TestResultParser::pushItem (ri::Item* item)
{
	m_itemStack.push_back(item);
	updateCurrentItemList();
}